

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O2

void WebRtcIsac_Spec2time
               (TransformTables *tables,double *inre,double *inim,double *outre1,double *outre2,
               FFTstr *fftstr_obj)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int dims;
  
  dims = 0xf0;
  lVar2 = 0x778;
  for (lVar3 = 0; lVar3 != 0x3c0; lVar3 = lVar3 + 8) {
    dVar5 = *(double *)((long)tables->costab2 + lVar3);
    dVar1 = *(double *)((long)tables->sintab2 + lVar3);
    dVar6 = *(double *)((long)inre + lVar3) * dVar5 + dVar1 * *(double *)((long)inim + lVar3);
    dVar4 = *(double *)((long)inim + lVar3) * dVar5 - dVar1 * *(double *)((long)inre + lVar3);
    dVar7 = -*(double *)((long)inim + lVar2) * dVar5 - dVar1 * *(double *)((long)inre + lVar2);
    dVar5 = dVar1 * *(double *)((long)inim + lVar2) - *(double *)((long)inre + lVar2) * dVar5;
    *(double *)((long)outre1 + lVar3) = dVar6 - dVar5;
    *(double *)((long)outre1 + lVar2) = dVar5 + dVar6;
    *(double *)((long)outre2 + lVar3) = dVar4 + dVar7;
    *(double *)((long)outre2 + lVar2) = dVar7 - dVar4;
    lVar2 = lVar2 + -8;
  }
  WebRtcIsac_Fftns(1,&dims,outre1,outre2,1,240.0,fftstr_obj);
  for (lVar2 = 0; lVar2 != 0xf0; lVar2 = lVar2 + 1) {
    dVar5 = tables->costab1[lVar2];
    dVar1 = tables->sintab1[lVar2];
    dVar4 = outre1[lVar2];
    dVar6 = outre2[lVar2];
    outre2[lVar2] = (dVar6 * dVar5 + dVar1 * dVar4) * 15.491933384829668;
    outre1[lVar2] = (dVar4 * dVar5 - dVar1 * dVar6) * 15.491933384829668;
  }
  return;
}

Assistant:

void WebRtcIsac_Spec2time(const TransformTables* tables,
                          double* inre,
                          double* inim,
                          double* outre1,
                          double* outre2,
                          FFTstr* fftstr_obj) {
  int k;
  double tmp1r, tmp1i, xr, xi, yr, yi, fact;

  int dims;

  dims = FRAMESAMPLES_HALF;

  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    /* Move zero in time to beginning of frames */
    tmp1r = tables->costab2[k];
    tmp1i = tables->sintab2[k];
    xr = inre[k] * tmp1r + inim[k] * tmp1i;
    xi = inim[k] * tmp1r - inre[k] * tmp1i;
    yr = -inim[FRAMESAMPLES_HALF - 1 - k] * tmp1r - inre[FRAMESAMPLES_HALF - 1 - k] * tmp1i;
    yi = -inre[FRAMESAMPLES_HALF - 1 - k] * tmp1r + inim[FRAMESAMPLES_HALF - 1 - k] * tmp1i;

    /* Combine into one vector,  z = x + j * y */
    outre1[k] = xr - yi;
    outre1[FRAMESAMPLES_HALF - 1 - k] = xr + yi;
    outre2[k] = xi + yr;
    outre2[FRAMESAMPLES_HALF - 1 - k] = -xi + yr;
  }


  /* Get IDFT */
  WebRtcIsac_Fftns(1, &dims, outre1, outre2, 1, FRAMESAMPLES_HALF, fftstr_obj);


  /* Demodulate and separate */
  fact = sqrt(FRAMESAMPLES_HALF);
  for (k = 0; k < FRAMESAMPLES_HALF; k++) {
    tmp1r = tables->costab1[k];
    tmp1i = tables->sintab1[k];
    xr = (outre1[k] * tmp1r - outre2[k] * tmp1i) * fact;
    outre2[k] = (outre2[k] * tmp1r + outre1[k] * tmp1i) * fact;
    outre1[k] = xr;
  }
}